

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

BeliefSet * __thiscall
AlphaVectorPlanning::SampleBeliefs
          (BeliefSet *__return_storage_ptr__,AlphaVectorPlanning *this,Arguments *args)

{
  DecPOMDPDiscreteInterface *pDVar1;
  long lVar2;
  long lVar3;
  pointer ppJVar4;
  BeliefSet *this_00;
  char cVar5;
  int j_1;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  size_t sVar10;
  undefined4 extraout_var;
  long *plVar11;
  ostream *poVar12;
  QMDP *this_01;
  undefined8 uVar13;
  PlanningUnitDecPOMDPDiscrete *pPVar14;
  JointBeliefInterface *pJVar15;
  E *this_02;
  size_type __n;
  int iVar16;
  int aQMDP;
  int iVar17;
  int j;
  undefined4 uVar18;
  ulong uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  uint local_c0;
  int local_bc;
  allocator<char> local_b5;
  int local_b4;
  long *local_b0;
  double local_a8;
  int local_9c;
  BeliefSet S;
  string local_60;
  BeliefSet *local_40;
  double local_38;
  undefined4 extraout_var_00;
  undefined1 extraout_var_01 [56];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"SampleBeliefs",(allocator<char> *)&S);
  TimedAlgorithm::StartTimer(&this->super_TimedAlgorithm,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar14 = this->_m_pu;
  if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar14 = (this->_m_puShared).px;
  }
  iVar8 = args->resetAfter;
  iVar17 = (int)(pPVar14->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon;
  sVar10 = PlanningUnitMADPDiscrete::GetNrStates(&pPVar14->super_PlanningUnitMADPDiscrete);
  pPVar14 = this->_m_pu;
  if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar14 = (this->_m_puShared).px;
  }
  local_40 = __return_storage_ptr__;
  iVar6 = (**(code **)((long)*(pPVar14->super_PlanningUnitMADPDiscrete)._m_madp + 0x68))();
  pPVar14 = this->_m_pu;
  if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar14 = (this->_m_puShared).px;
  }
  iVar16 = (int)sVar10;
  iVar7 = (*(pPVar14->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar14,(long)iVar16);
  local_b0 = (long *)CONCAT44(extraout_var,iVar7);
  pPVar14 = this->_m_pu;
  if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
    pPVar14 = (this->_m_puShared).px;
  }
  iVar7 = (*(pPVar14->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0xb])
                    (pPVar14,(long)iVar16);
  plVar11 = (long *)CONCAT44(extraout_var_00,iVar7);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            (&S,(long)args->nrBeliefs,(allocator_type *)&local_60);
  if ((iVar8 == 0) && (iVar8 = iVar17, iVar17 == 999999)) {
    poVar12 = std::operator<<((ostream *)&std::cout,
                              "Warning: sampling beliefs for an infinite horizon ");
    poVar12 = std::operator<<(poVar12,"without reset.");
    iVar8 = 999999;
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  if (args->useQMDPforSamplingBeliefs == 0) {
    this_01 = (QMDP *)0x0;
  }
  else {
    this_01 = (QMDP *)operator_new(0x70);
    pPVar14 = this->_m_pu;
    if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
      pPVar14 = (this->_m_puShared).px;
    }
    QMDP::QMDP(this_01,pPVar14,false);
    (**(code **)(*(long *)this_01 + 0x10))(this_01);
  }
  local_38 = (double)iVar6;
  local_bc = 0;
  local_c0 = 0;
  local_b4 = 0;
  local_9c = iVar8;
  if (iVar17 < iVar8) {
    local_9c = iVar17;
  }
  uVar18 = 0;
  do {
    __n = (size_type)(int)local_c0;
    if ((args->nrBeliefs <= (int)local_c0) || (args->nrBeliefs * 2 <= local_b4)) {
      if (local_b0 != (long *)0x0) {
        (**(code **)(*local_b0 + 8))();
      }
      this_00 = local_40;
      if (plVar11 != (long *)0x0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      if (this_01 != (QMDP *)0x0) {
        (**(code **)(*(long *)this_01 + 8))(this_01);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"SampleBeliefs",&local_b5);
      TimedAlgorithm::StopTimer(&this->super_TimedAlgorithm,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      ppJVar4 = S.
                super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      if ((int)local_c0 < args->nrBeliefs) {
        poVar12 = std::operator<<((ostream *)&std::cout,
                                  "AlphaVectorPlanning::SampleBeliefs: warning, only ");
        poVar12 = std::operator<<(poVar12,"managed to sample ");
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,local_c0);
        poVar12 = std::operator<<(poVar12," unique beliefs instead of ");
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,args->nrBeliefs);
        std::endl<char,std::char_traits<char>>(poVar12);
        std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
                  (this_00,__n,(allocator_type *)&local_60);
        for (uVar19 = 0; local_c0 != uVar19; uVar19 = uVar19 + 1) {
          (this_00->
          super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>).
          _M_impl.super__Vector_impl_data._M_start[uVar19] =
               S.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19];
        }
      }
      else {
        S.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (this_00->
        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)._M_impl
        .super__Vector_impl_data._M_start =
             S.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (this_00->
        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)._M_impl
        .super__Vector_impl_data._M_finish =
             S.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (this_00->
        super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>)._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppJVar4;
        S.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        S.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      std::_Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
      ~_Vector_base(&S.
                     super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   );
      return this_00;
    }
    if (local_9c < local_bc) {
      local_bc = 0;
    }
    if (local_bc == 0) {
      pPVar14 = this->_m_pu;
      if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar14 = (this->_m_puShared).px;
      }
      pDVar1 = pPVar14->_m_DecPOMDP;
      uVar18 = (**(code **)(*(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8))
                           + 0x160))((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8));
      pPVar14 = this->_m_pu;
      if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar14 = (this->_m_puShared).px;
      }
      lVar3 = *(long *)(*plVar11 + -0xb8);
      uVar13 = (**(code **)((long)*(pPVar14->super_PlanningUnitMADPDiscrete)._m_madp + 0x50))();
      (**(code **)(*(long *)((long)plVar11 + lVar3) + 0x28))((long)plVar11 + lVar3,uVar13);
    }
    else {
      if (args->useQMDPforSamplingBeliefs == 0) {
LAB_004156cf:
        iVar8 = rand();
        iVar8 = (int)((double)iVar8 * 4.656612873077393e-10 * local_38);
      }
      else {
        iVar8 = rand();
        if ((double)iVar8 * 4.656612873077393e-10 <= args->QMDPexploreProb) goto LAB_004156cf;
        auVar21 = ZEXT816(0xffefffffffffffff);
        iVar8 = 0x7fffffff;
        for (iVar17 = 0; iVar6 != iVar17; iVar17 = iVar17 + 1) {
          local_a8 = auVar21._0_8_;
          auVar22._0_8_ = (double)(**(code **)(*(long *)this_01 + 0x68))(this_01,local_b0,iVar17);
          auVar22._8_56_ = extraout_var_01;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_a8;
          auVar21 = vmaxsd_avx(auVar22._0_16_,auVar21);
          if (local_a8 < auVar22._0_8_) {
            iVar8 = iVar17;
          }
        }
      }
      pPVar14 = this->_m_pu;
      if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar14 = (this->_m_puShared).px;
      }
      pDVar1 = pPVar14->_m_DecPOMDP;
      uVar9 = (**(code **)(*(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8))
                          + 0x148))
                        ((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8),uVar18,iVar8)
      ;
      pPVar14 = this->_m_pu;
      if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar14 = (this->_m_puShared).px;
      }
      pDVar1 = pPVar14->_m_DecPOMDP;
      lVar3 = (long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8);
      lVar2 = *(long *)((long)&pDVar1->field_0x0 + *(long *)(*(long *)pDVar1 + -0xb8));
      if ((pPVar14->super_PlanningUnitMADPDiscrete)._m_params._m_eventObservability == true) {
        uVar18 = (**(code **)(lVar2 + 0x158))(lVar3,uVar18,iVar8,uVar9);
      }
      else {
        uVar18 = (**(code **)(lVar2 + 0x150))(lVar3,iVar8,uVar9);
      }
      (**(code **)(*plVar11 + 0xa8))(plVar11,local_b0);
      pPVar14 = this->_m_pu;
      if (pPVar14 == (PlanningUnitDecPOMDPDiscrete *)0x0) {
        pPVar14 = (this->_m_puShared).px;
      }
      (**(code **)(*plVar11 + 0xb0))
                (plVar11,(long)&pPVar14->_m_DecPOMDP->field_0x0 +
                         *(long *)(*(long *)pPVar14->_m_DecPOMDP + -0xb8),iVar8,uVar18);
      uVar18 = uVar9;
    }
    if (args->uniqueBeliefs != 0) {
      for (uVar19 = 0; uVar19 != local_c0; uVar19 = uVar19 + 1) {
        iVar8 = 0;
        do {
          if (iVar16 == iVar8) {
            local_b4 = local_b4 + 1;
            goto LAB_004158dd;
          }
          pJVar15 = S.
                    super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19];
          local_a8 = (double)(**(code **)(*(long *)((long)&pJVar15->field_0x0 +
                                                   *(long *)((long)*pJVar15 + -0xb8)) + 0x48))
                                       ((long)&pJVar15->field_0x0 +
                                        *(long *)((long)*pJVar15 + -0xb8),iVar8);
          dVar20 = (double)(**(code **)(*(long *)((long)plVar11 + *(long *)(*plVar11 + -0xb8)) +
                                       0x48))((long)plVar11 + *(long *)(*plVar11 + -0xb8),iVar8);
          iVar8 = iVar8 + 1;
        } while ((local_a8 == dVar20) && (!NAN(local_a8) && !NAN(dVar20)));
      }
    }
    cVar5 = (**(code **)(*(long *)((long)plVar11 + *(long *)(*plVar11 + -0xb8)) + 0x78))
                      ((long)plVar11 + *(long *)(*plVar11 + -0xb8));
    if (cVar5 == '\0') {
      this_02 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_02,"AlphaVectorPlanning::BeliefSampling belief fails sanity check");
      __cxa_throw(this_02,&E::typeinfo,E::~E);
    }
    pJVar15 = (JointBeliefInterface *)(**(code **)(*plVar11 + 0xb8))(plVar11);
    local_c0 = local_c0 + 1;
    S.super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>._M_impl.
    super__Vector_impl_data._M_start[__n] = pJVar15;
LAB_004158dd:
    local_bc = local_bc + 1;
    (**(code **)(*local_b0 + 0xa8))(local_b0,plVar11);
  } while( true );
}

Assistant:

BeliefSet AlphaVectorPlanning::SampleBeliefs(
    const ArgumentHandlers::Arguments &args) const
{
    StartTimer("SampleBeliefs");
    
    int resetAfter=args.resetAfter;
    int h=GetPU()->GetHorizon(),
        nrS=GetPU()->GetNrStates(),
        nrA=GetPU()->GetNrJointActions(),
        i,d=0,s;
    Index a;
    Index o;
    Index s0=0,s1;
    JointBeliefInterface *b0p, *b1p;
    b0p = GetPU()->GetNewJointBeliefInterface(nrS);
    b1p = GetPU()->GetNewJointBeliefInterface(nrS);
    JointBeliefInterface& b0 = *b0p;
    JointBeliefInterface& b1 = *b1p;
    BeliefSet S(args.nrBeliefs);
    bool foundEqualBelief,equal,addBelief;
    int nrEqualFound=0;

    // we don't want to artificially reset the problem
    if(resetAfter==0)
    {
        if(h==static_cast<int>(MAXHORIZON))
            cout << "Warning: sampling beliefs for an infinite horizon "
                 << "without reset." << endl;
        resetAfter=h;
    }

    QMDP *qmdp=0;
    if(args.useQMDPforSamplingBeliefs)
    {
        qmdp=new QMDP(GetPU());
        qmdp->Compute();
    }

    i=0;
    // make sure we don't try to keep on sampling beliefs if there are
    // not enough unique beliefs (<args.nrBeliefs)
    while(i<args.nrBeliefs && nrEqualFound<(args.nrBeliefs*2))
    {
        // reset the problem if either we exceeded the horizon, or the
        // user-supplied parameter (used in the infinite-horizon case)
        if(d>h || d>resetAfter)
            d=0;

        if(d==0)
        {
            s1=GetPU()->GetDPOMDPD()->SampleInitialState();
            b1.Set(* GetPU()->GetProblem()->GetISD());
        }
        else
        {
            if(args.useQMDPforSamplingBeliefs &&
               (rand() / (RAND_MAX + 1.0)) > args.QMDPexploreProb)
            {
                double valMax=-DBL_MAX;
                a=INT_MAX;
                for(int aQMDP=0;aQMDP!=nrA;++aQMDP)
                {
                    double qQMDP=qmdp->GetQ(b0,aQMDP);
                    if(qQMDP>valMax)
                    {
                        valMax=qQMDP;
                        a=aQMDP;
                    }
                }
            }
            else
            {
                // sample an action uniformly at random
                a=static_cast<int>(nrA*(rand() / (RAND_MAX + 1.0)));
            }

            s1=GetPU()->GetDPOMDPD()->SampleSuccessorState(s0,a);
            if(GetPU()->GetParams().GetEventObservability())
            {
                o=GetPU()->GetDPOMDPD()->SampleJointObservation(s0,a,s1);
            }
            else
            {
                o=GetPU()->GetDPOMDPD()->SampleJointObservation(a,s1);
            }
            b1=b0;
            b1.Update(*GetPU()->GetDPOMDPD(),a,o);
        }

        if(args.uniqueBeliefs)
        {
            foundEqualBelief=false;
            // loop over all beliefs already in S
            for(int j=0;j!=i;j++)
            {
                equal=true;
                for(s=0;s!=nrS;s++)
                {
                    // if one number differs we can move on to the next j
                    if(S[j]->Get(s)!=b1.Get(s))
                    {
                        equal=false;
                        break;
                    }
                }
                // if we found an equal belief we can stop
                if(equal)
                {
                    foundEqualBelief=true;
                    break;
                }
            }
            if(foundEqualBelief)
            {
                nrEqualFound++;
                addBelief=false;
            }
            else
                addBelief=true;
        }
        else
            addBelief=true;
        
        if(addBelief)
        {
            if(!b1.SanityCheck())
                throw(E("AlphaVectorPlanning::BeliefSampling belief fails sanity check"));

            S[i]=b1.Clone();
            i++;

            if(DEBUG_AlphaVectorPlanning_BeliefSampling)
            {
                cout << "AlphaVectorPlanning::SampleBeliefs sampled belief nr "
                     << i << "/" << args.nrBeliefs << " (nrEqualFound " 
                     << nrEqualFound << ")" << endl;
            }
        }
        
        d++;
        s0=s1;
        b0=b1;
    }

    delete b0p;
    delete b1p;
    delete qmdp;

    StopTimer("SampleBeliefs");

    // we did not manage to sample args.nrBeliefs unique beliefs
    if(i<args.nrBeliefs)
    {
        cout << "AlphaVectorPlanning::SampleBeliefs: warning, only " 
             << "managed to sample " << i << " unique beliefs instead of " 
             << args.nrBeliefs << endl;
        BeliefSet S1(i);
        for(int j=0;j!=i;j++)
            S1[j]=S[j];
        return(S1);
    }
    else
        return(S);
}